

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O2

void ncnn::resize_bilinear_c2
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  float fVar4;
  short *psVar5;
  short b0;
  int iVar6;
  void *pvVar7;
  short *rows1p;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  short *rows0_old;
  ulong uVar14;
  ulong uVar15;
  short *psVar16;
  short *rows0p;
  int iVar17;
  bool bVar18;
  uint uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  short *local_138;
  Mat local_c8;
  Mat local_78;
  
  uVar19 = (h + w) * 2;
  uVar10 = 0xffffffffffffffff;
  if (-1 < (int)uVar19) {
    uVar10 = (ulong)uVar19 * 4;
  }
  pvVar7 = operator_new__(uVar10);
  lVar9 = (long)w;
  uVar10 = 0;
  if (0 < w) {
    uVar10 = (ulong)(uint)w;
  }
  lVar1 = (long)h * 4 + lVar9 * 4;
  for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
    fVar4 = ((float)(int)uVar14 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
    fVar20 = floorf(fVar4);
    iVar6 = (int)fVar20;
    fVar23 = 0.0;
    bVar18 = -1 < iVar6;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (bVar18) {
      fVar23 = (fVar4 - (float)(int)fVar20) * 2048.0;
    }
    if (srcw + -1 <= iVar6) {
      fVar23 = 2048.0;
      iVar6 = srcw + -2;
    }
    *(int *)((long)pvVar7 + uVar14 * 4) = iVar6 * 2;
    uVar19 = -(uint)(0.0 <= 2048.0 - fVar23);
    auVar21._0_4_ = (int)((float)(uVar19 & 0x3f000000 | ~uVar19 & 0xbf000000) + (2048.0 - fVar23));
    auVar21._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar23) & 0x3f000000 | ~-(uint)(0.0 <= fVar23) & 0xbf000000) +
              fVar23);
    auVar21._8_8_ = 0;
    auVar21 = packssdw(auVar21,auVar21);
    *(int *)((long)pvVar7 + uVar14 * 4 + lVar1) = auVar21._0_4_;
  }
  uVar14 = 0;
  if (0 < h) {
    uVar14 = (ulong)(uint)h;
  }
  local_138 = (short *)((long)pvVar7 + (long)h * 4 + lVar9 * 8);
  for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
    fVar4 = ((float)(int)uVar15 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
    fVar20 = floorf(fVar4);
    iVar6 = (int)fVar20;
    fVar23 = 0.0;
    bVar18 = -1 < iVar6;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (bVar18) {
      fVar23 = (fVar4 - (float)(int)fVar20) * 2048.0;
    }
    iVar8 = iVar6;
    if (srch + -1 <= iVar6) {
      iVar8 = srch + -2;
    }
    *(int *)((long)pvVar7 + uVar15 * 4 + lVar9 * 4) = iVar8;
    if (srch + -1 <= iVar6) {
      fVar23 = 2048.0;
    }
    uVar19 = -(uint)(0.0 <= 2048.0 - fVar23);
    auVar22._0_4_ = (int)((float)(uVar19 & 0x3f000000 | ~uVar19 & 0xbf000000) + (2048.0 - fVar23));
    auVar22._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar23) & 0x3f000000 | ~-(uint)(0.0 <= fVar23) & 0xbf000000) +
              fVar23);
    auVar22._8_8_ = 0;
    auVar21 = packssdw(auVar22,auVar22);
    *(int *)(local_138 + uVar15 * 2) = auVar21._0_4_;
  }
  iVar6 = w * 2 + 2;
  local_c8.cstep = 0;
  local_c8.data = (short *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,iVar6,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (short *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,iVar6,2,(Allocator *)0x0);
  rows1p = (short *)local_78.data;
  psVar16 = (short *)local_c8.data;
  iVar6 = 0;
  iVar8 = -2;
LAB_0012d8c9:
  do {
    if (h <= iVar6) {
      operator_delete__(pvVar7);
      piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            free(local_c8.data);
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      return;
    }
    iVar2 = *(int *)((long)pvVar7 + (long)iVar6 * 4 + lVar9 * 4);
    psVar5 = rows1p;
    rows0p = psVar16;
    if (iVar2 != iVar8) {
      if (iVar2 == iVar8 + 1) {
        iVar8 = (iVar2 + 1) * srcstride;
        for (uVar14 = 0; psVar5 = psVar16, rows0p = rows1p, uVar10 != uVar14; uVar14 = uVar14 + 1) {
          lVar11 = (long)*(int *)((long)pvVar7 + uVar14 * 4);
          iVar17 = (int)*(short *)((long)pvVar7 + uVar14 * 4 + lVar1);
          iVar12 = (int)*(short *)((long)pvVar7 + uVar14 * 4 + lVar1 + 2);
          psVar16[uVar14 * 2] =
               (short)((uint)src[lVar11 + (long)iVar8 + 2] * iVar12 +
                       (uint)src[lVar11 + iVar8] * iVar17 >> 4);
          psVar16[uVar14 * 2 + 1] =
               (short)((uint)src[lVar11 + (long)iVar8 + 3] * iVar12 +
                       (uint)src[lVar11 + (long)iVar8 + 1] * iVar17 >> 4);
        }
      }
      else {
        iVar8 = iVar2 * srcstride;
        iVar17 = (iVar2 + 1) * srcstride;
        for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
          lVar11 = (long)*(int *)((long)pvVar7 + uVar14 * 4);
          iVar13 = (int)*(short *)((long)pvVar7 + uVar14 * 4 + lVar1);
          iVar12 = (int)*(short *)((long)pvVar7 + uVar14 * 4 + lVar1 + 2);
          psVar16[uVar14 * 2] =
               (short)((uint)src[lVar11 + (long)iVar8 + 2] * iVar12 +
                       (uint)src[lVar11 + iVar8] * iVar13 >> 4);
          psVar16[uVar14 * 2 + 1] =
               (short)((uint)src[lVar11 + (long)iVar8 + 3] * iVar12 +
                       (uint)src[lVar11 + (long)iVar8 + 1] * iVar13 >> 4);
          rows1p[uVar14 * 2] =
               (short)((uint)src[lVar11 + (long)iVar17 + 2] * iVar12 +
                       (uint)src[lVar11 + iVar17] * iVar13 >> 4);
          rows1p[uVar14 * 2 + 1] =
               (short)((uint)src[lVar11 + (long)iVar17 + 3] * iVar12 +
                       (uint)src[lVar11 + (long)iVar17 + 1] * iVar13 >> 4);
        }
      }
    }
    rows1p = psVar5;
    iVar17 = iVar6 + 1;
    psVar16 = rows0p;
    iVar8 = iVar2;
    if (iVar17 < h) {
      b0 = *local_138;
      if (*(int *)((long)pvVar7 + (long)iVar17 * 4 + lVar9 * 4) == iVar2) {
        vresize_two(rows0p,rows1p,w * 2,dst + iVar6 * stride,dst + iVar17 * stride,b0,local_138[1],
                    local_138[2],local_138[3]);
        local_138 = local_138 + 4;
        iVar6 = iVar6 + 2;
        goto LAB_0012d8c9;
      }
    }
    else {
      b0 = *local_138;
    }
    vresize_one(rows0p,rows1p,w * 2,dst + iVar6 * stride,b0,local_138[1]);
    local_138 = local_138 + 2;
    iVar6 = iVar17;
  } while( true );
}

Assistant:

void resize_bilinear_c2(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx * 2;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w * 2 + 2, (size_t)2u);
    Mat rowsbuf1(w * 2 + 2, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0a1XX = vld1_s16(ialphap);
                int16x4_t _a0a0a1a1 = vzip_s16(_a0a1XX, _a0a1XX).val[0];
                uint8x8_t _S1 = uint8x8_t();

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);

                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1lowhigh = vget_low_s16(_S116);
                int32x4_t _S1ma0a1 = vmull_s16(_S1lowhigh, _a0a0a1a1);
                int32x2_t _rows1low = vadd_s32(vget_low_s32(_S1ma0a1), vget_high_s32(_S1ma0a1));
                int32x4_t _rows1 = vcombine_s32(_rows1low, vget_high_s32(_S1ma0a1));
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                rows1p[0] = (S1p[0] * a0 + S1p[2] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[3] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 2;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = uint8x8_t();
                uint8x8_t _S1 = uint8x8_t();

                _S0 = vld1_lane_u8(S0p, _S0, 0);
                _S0 = vld1_lane_u8(S0p + 1, _S0, 1);
                _S0 = vld1_lane_u8(S0p + 2, _S0, 2);
                _S0 = vld1_lane_u8(S0p + 3, _S0, 3);

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);

                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0lowhigh = vget_low_s16(_S016);
                int16x4_t _S1lowhigh = vget_low_s16(_S116);
                int32x2x2_t _S0S1low_S0S1high = vtrn_s32(vreinterpret_s32_s16(_S0lowhigh), vreinterpret_s32_s16(_S1lowhigh));
                int32x4_t _rows01 = vmull_s16(vreinterpret_s16_s32(_S0S1low_S0S1high.val[0]), _a0);
                _rows01 = vmlal_s16(_rows01, vreinterpret_s16_s32(_S0S1low_S0S1high.val[1]), _a1);
                int16x4_t _rows01_sr4 = vshrn_n_s32(_rows01, 4);
                int16x4_t _rows1_sr4 = vext_s16(_rows01_sr4, _rows01_sr4, 2);
                vst1_s16(rows0p, _rows01_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0] * a0 + S0p[2] * a1) >> 4;
                rows0p[1] = (S0p[1] * a0 + S0p[3] * a1) >> 4;
                rows1p[0] = (S1p[0] * a0 + S1p[2] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[3] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 2;
                rows1p += 2;
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            unsigned char* Dp0 = dst + stride * dy;
            unsigned char* Dp1 = dst + stride * (dy + 1);

            vresize_two(rows0, rows1, w * 2, Dp0, Dp1, ibeta[0], ibeta[1], ibeta[2], ibeta[3]);

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            unsigned char* Dp = dst + stride * dy;

            vresize_one(rows0, rows1, w * 2, Dp, ibeta[0], ibeta[1]);

            ibeta += 2;
        }
    }

    delete[] buf;
}